

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O1

int BuildMapUaToAa(TIFFRGBAImage *img)

{
  uint8_t *puVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  
  if (img->UaToAa == (uint8_t *)0x0) {
    puVar1 = (uint8_t *)_TIFFmallocExt(img->tif,0x10000);
    img->UaToAa = puVar1;
    if (puVar1 == (uint8_t *)0x0) {
      iVar2 = 0;
      TIFFErrorExtR(img->tif,"BuildMapUaToAa","Out of memory");
    }
    else {
      iVar2 = 0;
      do {
        uVar4 = 0x7f;
        lVar3 = 0;
        do {
          puVar1[lVar3] = (uint8_t)((ulong)uVar4 / 0xff);
          uVar4 = uVar4 + iVar2;
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 != 0x100);
        iVar2 = iVar2 + 1;
        puVar1 = puVar1 + lVar3;
      } while (iVar2 != 0x100);
      iVar2 = 1;
    }
    return iVar2;
  }
  __assert_fail("img->UaToAa == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_getimage.c"
                ,0xc50,"int BuildMapUaToAa(TIFFRGBAImage *)");
}

Assistant:

static int BuildMapUaToAa(TIFFRGBAImage *img)
{
    static const char module[] = "BuildMapUaToAa";
    uint8_t *m;
    uint16_t na, nv;
    assert(img->UaToAa == NULL);
    img->UaToAa = _TIFFmallocExt(img->tif, 65536);
    if (img->UaToAa == NULL)
    {
        TIFFErrorExtR(img->tif, module, "Out of memory");
        return (0);
    }
    m = img->UaToAa;
    for (na = 0; na < 256; na++)
    {
        for (nv = 0; nv < 256; nv++)
            *m++ = (uint8_t)((nv * na + 127) / 255);
    }
    return (1);
}